

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O3

string * Utility::binary_to_hex(string *__return_storage_ptr__,string *bin_input)

{
  ulong uVar1;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  uVar1 = bin_input->_M_string_length;
  if ((uVar1 & 3) != 0) {
    do {
      std::operator+(&local_50,'0',bin_input);
      std::__cxx11::string::operator=((string *)bin_input,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      uVar1 = bin_input->_M_string_length;
    } while ((uVar1 & 3) != 0);
  }
  if (uVar1 != 0) {
    uVar1 = 0;
    do {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)bin_input);
      four_bits_to_hex(&local_70);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      uVar1 = uVar1 + 4;
    } while (uVar1 < bin_input->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Utility::binary_to_hex(std::string bin_input) {
    std::string output = "";

    while (bin_input.length() % 4 != 0)bin_input = '0' + bin_input;
    for (int i = 0; i < bin_input.length(); i = i + 4) {
        output += four_bits_to_hex(bin_input.substr(i, 4));
    }
    return output;
}